

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OMFormat.hh
# Opt level: O1

size_t __thiscall OpenMesh::IO::OMFormat::Header::restore(Header *this,istream *_is,bool _swap)

{
  long *plVar1;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  
  plVar1 = (long *)std::istream::read((char *)_is,(long)this);
  if ((*(byte *)((long)plVar1 + *(long *)(*plVar1 + -0x18) + 0x20) & 2) == 0) {
    sVar2 = binary<unsigned_int>::restore(_is,&this->n_vertices_,_swap);
    sVar3 = binary<unsigned_int>::restore(_is,&this->n_faces_,_swap);
    sVar4 = binary<unsigned_int>::restore(_is,&this->n_edges_,_swap);
    sVar2 = sVar4 + sVar3 + sVar2 + 4;
  }
  else {
    sVar2 = 0;
  }
  return sVar2;
}

Assistant:

size_t restore( std::istream& _is, bool _swap )
    {
      if (_is.read( (char*)this, 4 ).eof())
	return 0;

      size_t bytes = 4;
      bytes += binary<uint32_t>::restore( _is, n_vertices_, _swap );
      bytes += binary<uint32_t>::restore( _is, n_faces_, _swap );
      bytes += binary<uint32_t>::restore( _is, n_edges_, _swap );
      return bytes;
    }